

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O3

vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
* cutout(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
         *__return_storage_ptr__,tile_t *tile,rotation_e rotation)

{
  char cVar1;
  pointer pvVar2;
  pointer pcVar3;
  pointer pcVar4;
  int i;
  long lVar5;
  pointer pvVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pcVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  rotated;
  allocator_type local_41;
  value_type local_40;
  
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)operator_new(8);
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start + 8;
  *(undefined1 **)
   local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = &DAT_7878787878787878;
  local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,8,&local_40,&local_41);
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pcVar14 = (tile->data)._M_elems[1]._M_elems + 1;
  lVar5 = 0x12;
  uVar10 = 0;
  do {
    pvVar6 = (__return_storage_ptr__->
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(__return_storage_ptr__->
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
            -0x5555555555555555;
    if (uVar9 < uVar10 || uVar9 - uVar10 == 0) {
      uVar8 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar8);
    }
    lVar7 = *(long *)&pvVar6[uVar10].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data;
    uVar9 = 9;
    lVar13 = 0;
    do {
      *(char *)(lVar7 + lVar13) = pcVar14[lVar13];
      uVar9 = uVar9 - 1;
      lVar13 = lVar13 + 1;
    } while (1 < uVar9);
    lVar5 = lVar5 + 10;
    pcVar14 = pcVar14 + 10;
    uVar10 = uVar10 + 1;
  } while (lVar5 != 0x62);
  if (3 < (int)rotation) {
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar6 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar2; pvVar6 = pvVar6 + 1)
    {
      pcVar3 = (pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = (pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar11 = pcVar4 + -1;
      if (pcVar3 < pcVar11 && pcVar3 != pcVar4) {
        do {
          pcVar14 = pcVar3 + 1;
          cVar1 = *pcVar3;
          *pcVar3 = *pcVar11;
          *pcVar11 = cVar1;
          pcVar11 = pcVar11 + -1;
          pcVar3 = pcVar14;
        } while (pcVar14 < pcVar11);
      }
    }
    rotation = rotation - FlipRot0;
  }
  if (rotation != Rot0) {
    lVar5 = 0;
    do {
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)&local_40,__return_storage_ptr__);
      lVar7 = 0;
      do {
        lVar13 = 0;
        lVar12 = 0;
        do {
          *(undefined1 *)
           (*(long *)(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7 * 0x18) + lVar12) =
               *(undefined1 *)
                (*(long *)((long)&(((__return_storage_ptr__->
                                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data + lVar13) + (7 - lVar7));
          lVar12 = lVar12 + 1;
          lVar13 = lVar13 + 0x18;
        } while (lVar12 != 8);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator=(__return_storage_ptr__,
                  (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   *)&local_40);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *)&local_40);
      lVar5 = lVar5 + 1;
    } while (lVar5 != (int)rotation);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<char>> cutout(const tile_t& tile, tile_t::rotation_e rotation) {
  auto len = tile_t::N-2;
  std::vector<std::vector<char>> cutout (len, std::vector<char>(len, 'x'));

  size_t i = 0;
  ranges::for_each(tile.data.cbegin() + 1, tile.data.cend() - 1, [&](const auto& row){
    ranges::copy(row.cbegin() + 1, row.cend() - 1, cutout.at(i++).begin());
  });

  auto steps = static_cast<int>(rotation);
  if (steps >= 4) {
    steps -= 4;
    ranges::for_each(cutout, [](auto& row){
      ranges::reverse(row);
    });
  }
  for (size_t rot = 0; rot < steps; rot++) {
    auto rotated = cutout;
    for (int i = 0; i < len; ++i) {
      for (int j = 0; j < len; ++j) {
        rotated[i][j] = cutout[j][len - i - 1];
      }
    }
    cutout = rotated;
  }

  return cutout;
}